

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcMux.c
# Opt level: O2

Lpk_Res_t * Lpk_MuxAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Lpk_Res_t *pLVar12;
  char cVar13;
  byte bVar14;
  uint uVar15;
  char *pcVar16;
  char cVar17;
  uint uVar18;
  long lVar19;
  
  Lpk_MuxAnalize::Res.nSuppSizeS = 0;
  Lpk_MuxAnalize::Res.nSuppSizeL = 0;
  Lpk_MuxAnalize::Res.DelayEst = 0;
  Lpk_MuxAnalize::Res.AreaEst = 0;
  Lpk_MuxAnalize::Res.nBSVars = 0;
  Lpk_MuxAnalize::Res.BSVars = 0;
  Lpk_MuxAnalize::Res.nCofVars = 0;
  Lpk_MuxAnalize::Res.pCofVars[0] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[1] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[2] = '\0';
  Lpk_MuxAnalize::Res.pCofVars[3] = '\0';
  Lpk_MuxAnalize::Res.Variable = 0;
  Lpk_MuxAnalize::Res.Polarity = 0;
  if ((-1 << ((byte)(*(uint *)&p->field_0x8 >> 7) & 0x1f) ^ p->uSupp) == 0xffffffff) {
    if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
      pcVar16 = "p->fSupports";
      uVar18 = 0x34;
    }
    else {
      Lpk_MuxAnalize::Res.Variable = -1;
      Lpk_MuxAnalize::Res.Polarity = 0;
      pcVar16 = p->pDelays;
      lVar19 = 0;
      while( true ) {
        if (lVar19 == 0x10) {
          pLVar12 = (Lpk_Res_t *)0x0;
          if (Lpk_MuxAnalize::Res.Variable != -1) {
            pLVar12 = &Lpk_MuxAnalize::Res;
          }
          return pLVar12;
        }
        uVar18 = 1 << ((byte)lVar19 & 0x1f);
        if ((p->uSupp >> ((uint)lVar19 & 0x1f) & 1) == 0) goto LAB_003ce7b9;
        uVar1 = p->puSupps[lVar19 * 2];
        uVar6 = Kit_WordCountOnes(uVar1);
        uVar2 = p->puSupps[lVar19 * 2 + 1];
        uVar7 = Kit_WordCountOnes(uVar2);
        uVar15 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
        if (uVar15 <= uVar6) break;
        if (uVar15 <= uVar7) {
          pcVar16 = "nSuppSize1 < (int)p->nVars";
          uVar18 = 0x3c;
          goto LAB_003ce851;
        }
        if ((uVar6 != 0) && (uVar7 != 0)) {
          uVar15 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
          iVar8 = uVar15 - 2;
          if ((iVar8 < (int)uVar6) || (iVar8 < (int)uVar7)) {
            cVar13 = (char)uVar7;
            if (iVar8 < (int)uVar6) {
              cVar5 = (char)uVar6;
              if (iVar8 < (int)uVar7) {
                if (uVar15 < uVar6) {
                  iVar11 = Lpk_SuppDelay(uVar1 | uVar18,pcVar16);
                  iVar9 = Lpk_SuppDelay(p->puSupps[lVar19 * 2 + 1],pcVar16);
                  iVar8 = iVar9 + 1;
                  if (iVar9 + 1 < iVar11) {
                    iVar8 = iVar11;
                  }
                  if (uVar7 <= uVar15) {
                    uVar18 = *(uint *)&p->field_0x8;
                    bVar14 = (byte)(uVar18 >> 0xc);
                    cVar5 = cVar5 + '\x01';
                    goto LAB_003ce655;
                  }
                  iVar11 = Lpk_SuppDelay(uVar18 | p->puSupps[lVar19 * 2 + 1],pcVar16);
                  iVar10 = Lpk_SuppDelay(p->puSupps[lVar19 * 2],pcVar16);
                  iVar9 = iVar10 + 1;
                  if (iVar10 + 1 < iVar11) {
                    iVar9 = iVar11;
                  }
                  uVar18 = *(uint *)&p->field_0x8;
                  cVar17 = ((byte)(uVar18 >> 0xc) & 0xf) - 1;
                  iVar10 = iVar9;
                  if (iVar8 < iVar9) {
                    iVar10 = iVar8;
                  }
                  cVar3 = cVar13;
                  if (iVar9 < iVar8) {
                    cVar3 = cVar5;
                    cVar5 = cVar13;
                  }
                  iVar11 = (((int)((char)(cVar5 + '\x01') / cVar17) -
                            (uint)((char)(cVar5 + '\x01') % cVar17 == '\0')) +
                            (int)((char)(cVar3 + -1) / cVar17) + 2) -
                           (uint)((char)(cVar3 + -1) % cVar17 == '\0');
                  bVar4 = iVar9 <= iVar8;
                  iVar8 = iVar10;
                }
                else {
                  iVar11 = Lpk_SuppDelay(uVar2 | uVar18,pcVar16);
                  iVar9 = Lpk_SuppDelay(p->puSupps[lVar19 * 2],pcVar16);
                  iVar8 = iVar9 + 1;
                  if (iVar9 + 1 < iVar11) {
                    iVar8 = iVar11;
                  }
                  uVar18 = *(uint *)&p->field_0x8;
                  cVar5 = ((byte)(uVar18 >> 0xc) & 0xf) - 1;
                  iVar11 = ((int)((char)(cVar13 + '\x01') / cVar5) -
                           (uint)((char)(cVar13 + '\x01') % cVar5 == '\0')) + 2;
                  bVar4 = true;
                }
              }
              else {
                iVar11 = Lpk_SuppDelay(uVar2 | uVar18,pcVar16);
                iVar9 = Lpk_SuppDelay(p->puSupps[lVar19 * 2],pcVar16);
                iVar8 = iVar9 + 1;
                if (iVar9 + 1 < iVar11) {
                  iVar8 = iVar11;
                }
                uVar18 = *(uint *)&p->field_0x8;
                cVar13 = ((byte)(uVar18 >> 0xc) & 0xf) - 1;
                iVar11 = ((int)((char)(cVar5 + -1) / cVar13) -
                         (uint)((char)(cVar5 + -1) % cVar13 == '\0')) + 2;
                bVar4 = true;
              }
            }
            else {
              iVar11 = Lpk_SuppDelay(uVar1 | uVar18,pcVar16);
              iVar9 = Lpk_SuppDelay(p->puSupps[lVar19 * 2 + 1],pcVar16);
              iVar8 = iVar9 + 1;
              if (iVar9 + 1 < iVar11) {
                iVar8 = iVar11;
              }
              uVar18 = *(uint *)&p->field_0x8;
              bVar14 = (byte)(uVar18 >> 0xc);
              cVar5 = cVar13 + -1;
LAB_003ce655:
              cVar13 = (bVar14 & 0xf) - 1;
              iVar11 = ((int)(cVar5 / cVar13) - (uint)(cVar5 % cVar13 == '\0')) + 2;
              bVar4 = false;
            }
          }
          else {
            iVar8 = Lpk_SuppDelay(uVar1 | uVar18,pcVar16);
            iVar9 = Lpk_SuppDelay(p->puSupps[lVar19 * 2 + 1],pcVar16);
            iVar11 = iVar9 + 1;
            if (iVar9 + 1 < iVar8) {
              iVar11 = iVar8;
            }
            iVar8 = Lpk_SuppDelay(uVar18 | p->puSupps[lVar19 * 2 + 1],pcVar16);
            iVar10 = Lpk_SuppDelay(p->puSupps[lVar19 * 2],pcVar16);
            iVar9 = iVar10 + 1;
            if (iVar10 + 1 < iVar8) {
              iVar9 = iVar8;
            }
            iVar8 = iVar9;
            if (iVar11 < iVar9) {
              iVar8 = iVar11;
            }
            bVar4 = iVar9 <= iVar11;
            uVar18 = *(uint *)&p->field_0x8;
            iVar11 = 2;
          }
          if ((iVar8 <= (int)(uVar18 >> 0x15 & 0x1ff)) && (iVar11 <= (int)(uVar18 >> 0x10 & 0x1f)))
          {
            uVar6 = uVar6 + (uint)(bVar4 ^ 1) * 2;
            uVar7 = uVar7 + (uint)bVar4 * 2;
            uVar1 = uVar7;
            if (uVar6 < uVar7) {
              uVar1 = uVar6;
            }
            uVar2 = uVar7;
            if (uVar7 < uVar6) {
              uVar2 = uVar6;
            }
            if (uVar2 <= (uVar18 >> 7 & 0x1f)) {
              if (Lpk_MuxAnalize::Res.Variable != -1) {
                if (Lpk_MuxAnalize::Res.AreaEst <= iVar11) {
                  if (Lpk_MuxAnalize::Res.AreaEst == iVar11) {
                    if (((int)(uVar6 + uVar7) <
                         Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS) ||
                       ((Lpk_MuxAnalize::Res.nSuppSizeL + Lpk_MuxAnalize::Res.nSuppSizeS ==
                         uVar6 + uVar7 && (iVar8 < Lpk_MuxAnalize::Res.DelayEst))))
                    goto LAB_003ce793;
                  }
                  goto LAB_003ce7b9;
                }
              }
LAB_003ce793:
              Lpk_MuxAnalize::Res.Polarity._0_1_ = bVar4;
              Lpk_MuxAnalize::Res.Variable = (uint)lVar19;
              Lpk_MuxAnalize::Res.Polarity._1_3_ = 0;
              Lpk_MuxAnalize::Res.AreaEst = iVar11;
              Lpk_MuxAnalize::Res.DelayEst = iVar8;
              Lpk_MuxAnalize::Res.nSuppSizeL = uVar2;
              Lpk_MuxAnalize::Res.nSuppSizeS = uVar1;
            }
          }
        }
LAB_003ce7b9:
        lVar19 = lVar19 + 1;
      }
      pcVar16 = "nSuppSize0 < (int)p->nVars";
      uVar18 = 0x3b;
    }
  }
  else {
    pcVar16 = "p->uSupp == Kit_BitMask(p->nVars)";
    uVar18 = 0x33;
  }
LAB_003ce851:
  __assert_fail(pcVar16,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcMux.c"
                ,uVar18,"Lpk_Res_t *Lpk_MuxAnalize(Lpk_Man_t *, Lpk_Fun_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the possibility of MUX decomposition.]

  Description [Returns the best variable to use for MUX decomposition.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Lpk_Res_t * Lpk_MuxAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p )
{
    static Lpk_Res_t Res, * pRes = &Res;
    int nSuppSize0, nSuppSize1, nSuppSizeS, nSuppSizeL;
    int Var, Area, Polarity, Delay, Delay0, Delay1, DelayA, DelayB;
    memset( pRes, 0, sizeof(Lpk_Res_t) );
    assert( p->uSupp == Kit_BitMask(p->nVars) );
    assert( p->fSupports );
    // derive the delay and area after MUX-decomp with each var - and find the best var
    pRes->Variable = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        nSuppSize0 = Kit_WordCountOnes(p->puSupps[2*Var+0]);
        nSuppSize1 = Kit_WordCountOnes(p->puSupps[2*Var+1]);
        assert( nSuppSize0 < (int)p->nVars );
        assert( nSuppSize1 < (int)p->nVars );
        if ( nSuppSize0 < 1 || nSuppSize1 < 1 )
            continue;
//printf( "%d %d    ", nSuppSize0, nSuppSize1 );
        if ( nSuppSize0 <= (int)p->nLutK - 2 && nSuppSize1 <= (int)p->nLutK - 2 )
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            Area = 2;
            Polarity = (int)(Delay == Delay1);
        }
        else if ( nSuppSize0 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            Polarity = 0;
        }
        else if ( nSuppSize1 <= (int)p->nLutK - 2 )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize0 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize1+2, p->nLutK );
            Polarity = 1;
        }
        else if ( nSuppSize1 <= (int)p->nLutK )
        {
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay = Abc_MaxInt( DelayA, DelayB + 1 );
            Area = 1 + Lpk_LutNumLuts( nSuppSize0+2, p->nLutK );
            Polarity = 0;
        }
        else
        {
            // include cof var into 0-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+0] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+1]           , p->pDelays );
            Delay0 = Abc_MaxInt( DelayA, DelayB + 1 );
            // include cof var into 1-block
            DelayA = Lpk_SuppDelay( p->puSupps[2*Var+1] | (1<<Var), p->pDelays );
            DelayB = Lpk_SuppDelay( p->puSupps[2*Var+0]           , p->pDelays );
            Delay1 = Abc_MaxInt( DelayA, DelayB + 1 );
            // get the best delay
            Delay = Abc_MinInt( Delay0, Delay1 );
            if ( Delay == Delay0 )
                Area = Lpk_LutNumLuts( nSuppSize0+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize1, p->nLutK );
            else
                Area = Lpk_LutNumLuts( nSuppSize1+2, p->nLutK ) + Lpk_LutNumLuts( nSuppSize0, p->nLutK );
            Polarity = (int)(Delay == Delay1);
        }
        // find the best variable
        if ( Delay > (int)p->nDelayLim )
            continue;
        if ( Area > (int)p->nAreaLim )
            continue;
        nSuppSizeS = Abc_MinInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        nSuppSizeL = Abc_MaxInt( nSuppSize0 + 2 *!Polarity, nSuppSize1 + 2 * Polarity );
        if ( nSuppSizeL > (int)p->nVars )
            continue;
        if ( pRes->Variable == -1 || pRes->AreaEst > Area || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL > nSuppSizeS + nSuppSizeL) || 
            (pRes->AreaEst == Area && pRes->nSuppSizeS + pRes->nSuppSizeL == nSuppSizeS + nSuppSizeL && pRes->DelayEst > Delay) )
        {
            pRes->Variable = Var;
            pRes->Polarity = Polarity;
            pRes->AreaEst  = Area;
            pRes->DelayEst = Delay;
            pRes->nSuppSizeS = nSuppSizeS;
            pRes->nSuppSizeL = nSuppSizeL;
        }
    }
    return pRes->Variable == -1 ? NULL : pRes;
}